

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::outsubfaces(tetgenmesh *this,tetgenio *out)

{
  uint uVar1;
  memorypool *pmVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  int *piVar6;
  size_t sVar7;
  shellface *pppdVar8;
  long lVar9;
  tetgenbehavior *ptVar10;
  uint uVar11;
  ulong uVar12;
  tetgenmesh *ptVar13;
  shellface ppdVar14;
  shellface ppdVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint local_498;
  uint local_494;
  FILE *local_488;
  uint local_480;
  int local_47c;
  uint local_478;
  int local_474;
  int local_470;
  uint local_46c;
  point pp [3];
  int *local_448;
  int *local_440;
  char facefilename [1024];
  
  pp[2] = (point)0x0;
  pp[0] = (point)0x0;
  pp[1] = (point)0x0;
  ptVar10 = this->b;
  if (out == (tetgenio *)0x0) {
    strcpy(facefilename,ptVar10->outfilename);
    sVar7 = strlen(facefilename);
    builtin_strncpy(facefilename + sVar7,".face",6);
    if (ptVar10->quiet == 0) {
      printf("Writing %s.\n",facefilename);
    }
    local_488 = fopen(facefilename,"w");
    if (local_488 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",facefilename);
      terminatetetgen(this,3);
    }
    local_448 = (int *)0x0;
    fprintf(local_488,"%ld  %d\n",this->subfaces->items,(ulong)(this->b->nobound == 0));
    ptVar10 = this->b;
    local_440 = (int *)0x0;
  }
  else {
    if (ptVar10->quiet == 0) {
      puts("Writing faces.");
      ptVar10 = this->b;
    }
    pmVar2 = this->subfaces;
    local_440 = (int *)operator_new__(-(ulong)((ulong)(pmVar2->items * 3) >> 0x3e != 0) |
                                      pmVar2->items * 0xc);
    out->trifacelist = local_440;
    if (ptVar10->order == 2) {
      uVar12 = pmVar2->items * 0xc;
      if (0x3fffffffffffffff < (ulong)(pmVar2->items * 3)) {
        uVar12 = 0xffffffffffffffff;
      }
      piVar6 = (int *)operator_new__(uVar12);
      out->o2facelist = piVar6;
    }
    if (ptVar10->nobound == 0) {
      uVar12 = pmVar2->items * 4;
      if (0x3fffffffffffffff < (ulong)pmVar2->items) {
        uVar12 = 0xffffffffffffffff;
      }
      piVar6 = (int *)operator_new__(uVar12);
      out->trifacemarkerlist = piVar6;
    }
    if (1 < ptVar10->neighout) {
      piVar6 = (int *)operator_new__(-(ulong)((pmVar2->items & 0x6000000000000000U) != 0) |
                                     pmVar2->items << 3);
      out->face2tetlist = piVar6;
    }
    out->numberoftrifaces = (int)pmVar2->items;
    local_448 = out->trifacemarkerlist;
    local_488 = (FILE *)0x0;
  }
  ptVar13 = (tetgenmesh *)this->subfaces;
  uVar1 = this->in->firstnumber;
  local_46c = 0;
  if (ptVar10->zeroindex == 0) {
    local_46c = uVar1;
  }
  bVar5 = local_46c == 0;
  memorypool::traversalinit((memorypool *)ptVar13);
  pppdVar8 = shellfacetraverse(ptVar13,this->subfaces);
  uVar4 = 0xffffffff;
  local_470 = 0;
  local_47c = 0;
  local_474 = 0;
  local_480 = 0;
  local_494 = 0;
  local_498 = 0;
  local_478 = 0;
  do {
    if (pppdVar8 == (shellface *)0x0) {
      if (out == (tetgenio *)0x0) {
        fprintf(local_488,"# Generated by %s\n",this->b->commandline);
        fclose(local_488);
      }
      return;
    }
    uVar12 = (ulong)pppdVar8[9] & 0xfffffffffffffff0;
    uVar11 = (uint)pppdVar8[9];
    if (uVar12 == 0) {
LAB_00145136:
      ppdVar15 = pppdVar8[sorgpivot[0]];
      ppdVar14 = pppdVar8[sdestpivot[0]];
      ptVar13 = (tetgenmesh *)pppdVar8[sapexpivot[0]];
      ptVar10 = this->b;
      if (ptVar10->order == 2) {
        pp[0] = (point)ppdVar15;
        pp[1] = (point)ppdVar14;
        pp[2] = (point)ptVar13;
      }
    }
    else {
      uVar17 = stpivottbl[uVar11 & 0xf][0];
      uVar16 = uVar12;
      if (*(point *)(uVar12 + 0x38) == this->dummypoint) {
        uVar3 = *(ulong *)(uVar12 + (ulong)(uVar17 & 3) * 8);
        uVar16 = uVar3 & 0xfffffffffffffff0;
        if (uVar16 == 0) goto LAB_00145136;
        uVar17 = fsymtbl[(int)uVar17][(uint)uVar3 & 0xf];
      }
      ppdVar15 = *(shellface *)(uVar16 + (long)orgpivot[(int)uVar17] * 8);
      ppdVar14 = *(shellface *)(uVar16 + (long)destpivot[(int)uVar17] * 8);
      ptVar13 = *(tetgenmesh **)(uVar16 + (long)apexpivot[(int)uVar17] * 8);
      ptVar10 = this->b;
      if (ptVar10->order == 2) {
        lVar9 = *(long *)(uVar16 + 0x58);
        for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
          pp[lVar18] = *(point *)(lVar9 + (long)ver2edge[(int)uVar17] * 8);
          uVar17 = enexttbl[(int)uVar17];
        }
      }
    }
    if (ptVar10->nobound == 0) {
      local_480 = *(uint *)((long)pppdVar8 + (long)this->shmarkindex * 4);
    }
    if ((1 < ptVar10->neighout) && (local_498 = uVar4, local_494 = uVar4, uVar12 != 0)) {
      if (*(point *)(uVar12 + 0x38) != this->dummypoint) {
        local_494 = *(uint *)(uVar12 + 0x50);
      }
      uVar12 = *(ulong *)(uVar12 + (ulong)(stpivottbl[uVar11 & 0xf][0] & 3) * 8) &
               0xfffffffffffffff0;
      if (*(point *)(uVar12 + 0x38) != this->dummypoint) {
        local_498 = *(uint *)(uVar12 + 0x50);
      }
    }
    lVar9 = (long)this->pointmarkindex;
    uVar17 = (uint)(uVar1 == 1 && bVar5);
    uVar11 = *(int *)((long)ppdVar15 + lVar9 * 4) - uVar17;
    if (out == (tetgenio *)0x0) {
      fprintf(local_488,"%5d   %4d  %4d  %4d",(ulong)local_46c,(ulong)uVar11,
              (ulong)(*(int *)((long)ppdVar14 + lVar9 * 4) - uVar17),
              (ulong)(*(int *)((long)&ptVar13->in + lVar9 * 4) - uVar17));
      ptVar10 = this->b;
      if (ptVar10->order == 2) {
        lVar9 = (long)this->pointmarkindex;
        fprintf(local_488,"  %4d  %4d  %4d",(ulong)(*(int *)((long)pp[0] + lVar9 * 4) - uVar17),
                (ulong)(*(int *)((long)pp[1] + lVar9 * 4) - uVar17),
                (ulong)(*(int *)((long)pp[2] + lVar9 * 4) - uVar17));
        ptVar10 = this->b;
      }
      if (ptVar10->nobound == 0) {
        fprintf(local_488,"    %d",(ulong)local_480);
        ptVar10 = this->b;
      }
      if (1 < ptVar10->neighout) {
        fprintf(local_488,"    %5d  %5d",(ulong)local_494,(ulong)local_498);
      }
      ptVar13 = (tetgenmesh *)0xa;
      fputc(10,local_488);
    }
    else {
      lVar18 = (long)local_470;
      local_440[lVar18] = uVar11;
      local_440[lVar18 + 1] = *(int *)((long)ppdVar14 + lVar9 * 4) - uVar17;
      local_440[lVar18 + 2] = *(int *)((long)&ptVar13->in + lVar9 * 4) - uVar17;
      if (ptVar10->order == 2) {
        piVar6 = out->o2facelist;
        lVar18 = (long)(int)local_478;
        piVar6[lVar18] = *(int *)((long)pp[0] + lVar9 * 4) - uVar17;
        piVar6[lVar18 + 1] = *(int *)((long)pp[1] + (long)this->pointmarkindex * 4) - uVar17;
        local_478 = local_478 + 3;
        ptVar13 = (tetgenmesh *)(ulong)local_478;
        piVar6[lVar18 + 2] = *(int *)((long)pp[2] + (long)this->pointmarkindex * 4) - uVar17;
      }
      if (ptVar10->nobound == 0) {
        lVar9 = (long)local_47c;
        local_47c = local_47c + 1;
        local_448[lVar9] = local_480;
      }
      local_470 = local_470 + 3;
      if (1 < ptVar10->neighout) {
        piVar6 = out->face2tetlist;
        lVar9 = (long)local_474;
        piVar6[lVar9] = local_494;
        local_474 = local_474 + 2;
        piVar6[lVar9 + 1] = local_498;
      }
    }
    local_46c = local_46c + 1;
    pppdVar8 = shellfacetraverse(ptVar13,this->subfaces);
  } while( true );
}

Assistant:

void tetgenmesh::outsubfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  int *elist = NULL;
  int *emlist = NULL;
  int index = 0, index1 = 0, index2 = 0;
  triface abuttingtet;
  face faceloop;
  point torg, tdest, tapex;
  int marker = 0;
  int firstindex, shift;
  int neigh1 = 0, neigh2 = 0;
  int facenumber;

  // For -o2 option.
  triface workface;
  point *extralist, pp[3] = {0,0,0}; 
  int highorderindex = 11;
  int o2index = 0, i;

  int t1ver; // used by fsymself()

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 3);
    }
    // Number of subfaces.
    fprintf(outfile, "%ld  %d\n", subfaces->items, !b->nobound);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[subfaces->items * 3];
    if (out->trifacelist == (int *) NULL) {
      terminatetetgen(this, 1);
    }
    if (b->order == 2) {
      out->o2facelist = new int[subfaces->items * 3];
    }
    if (!b->nobound) {
      // Allocate memory for 'trifacemarkerlist'.
      out->trifacemarkerlist = new int[subfaces->items];
      if (out->trifacemarkerlist == (int *) NULL) {
        terminatetetgen(this, 1);
      }
    }
    if (b->neighout > 1) {
      // '-nn' switch.
      out->face2tetlist = new int[subfaces->items * 2];
      if (out->face2tetlist == (int *) NULL) {
        terminatetetgen(this, 1);
      }
    }
    out->numberoftrifaces = subfaces->items;
    elist = out->trifacelist;
    emlist = out->trifacemarkerlist;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  subfaces->traversalinit();
  faceloop.sh = shellfacetraverse(subfaces);
  facenumber = firstindex; // in->firstnumber;
  while (faceloop.sh != (shellface *) NULL) {
    stpivot(faceloop, abuttingtet);
    // If there is a tetrahedron containing this subface, orient it so
    //   that the normal of this face points to inside of the volume by
    //   right-hand rule.
    if (abuttingtet.tet != NULL) {
      if (ishulltet(abuttingtet)) {
        fsymself(abuttingtet);
      }
    }
    if (abuttingtet.tet != NULL) {
      torg = org(abuttingtet);
      tdest = dest(abuttingtet);
      tapex = apex(abuttingtet);
      if (b->order == 2) { // -o2
        // Get the three extra vertices on edges.
        extralist = (point *) (abuttingtet.tet[highorderindex]);
        workface = abuttingtet;
        for (i = 0; i < 3; i++) {
          pp[i] = extralist[ver2edge[workface.ver]];
          enextself(workface);
        }
      }
    } else {
      // This may happen when only a surface mesh be generated.
      torg = sorg(faceloop);
      tdest = sdest(faceloop);
      tapex = sapex(faceloop);
      if (b->order == 2) { // -o2
        // There is no extra node list available.
        pp[0] = torg;
        pp[1] = tdest;
        pp[2] = tapex;
      }
    }
    if (!b->nobound) {
      marker = shellmark(faceloop);
    }
    if (b->neighout > 1) {
      // '-nn' switch. Output adjacent tets indices.
      neigh1 = -1;
      neigh2 = -1;
      stpivot(faceloop, abuttingtet);
      if (abuttingtet.tet != NULL) {
        if (!ishulltet(abuttingtet)) {
          neigh1 = elemindex(abuttingtet.tet);
        }
        fsymself(abuttingtet);
        if (!ishulltet(abuttingtet)) {
          neigh2 = elemindex(abuttingtet.tet);
        }
      }
    }
    if (out == (tetgenio *) NULL) {
      fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
              pointmark(torg) - shift, pointmark(tdest) - shift,
              pointmark(tapex) - shift);
      if (b->order == 2) { // -o2
        fprintf(outfile, "  %4d  %4d  %4d", pointmark(pp[0]) - shift, 
                pointmark(pp[1]) - shift, pointmark(pp[2]) - shift);
      }
      if (!b->nobound) {
        fprintf(outfile, "    %d", marker);
      }
      if (b->neighout > 1) {
        fprintf(outfile, "    %5d  %5d", neigh1, neigh2);
      }
      fprintf(outfile, "\n");
    } else {
      // Output three vertices of this face;
      elist[index++] = pointmark(torg) - shift;
      elist[index++] = pointmark(tdest) - shift;
      elist[index++] = pointmark(tapex) - shift;
      if (b->order == 2) { // -o2
        out->o2facelist[o2index++] = pointmark(pp[0]) - shift;
        out->o2facelist[o2index++] = pointmark(pp[1]) - shift;
        out->o2facelist[o2index++] = pointmark(pp[2]) - shift;
      }
      if (!b->nobound) {
        emlist[index1++] = marker;
      }
      if (b->neighout > 1) {
        out->face2tetlist[index2++] = neigh1;
        out->face2tetlist[index2++] = neigh2;
      }
    }
    facenumber++;
    faceloop.sh = shellfacetraverse(subfaces);
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}